

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

NodePtr __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
::divideTree(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *obj,unsigned_long left,unsigned_long right,BoundingBox *bbox)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  double dVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  NodePtr pNVar11;
  ulong uVar12;
  BoundingBox *pBVar13;
  NodePtr pNVar14;
  ulong uVar15;
  undefined1 *puVar16;
  BoundingBox *pBVar17;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *obj_00;
  BoundingBox *pBVar18;
  undefined1 *puVar19;
  BoundingBox *bbox_00;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  BoundingBox right_bbox;
  BoundingBox left_bbox;
  double local_98;
  long alStack_90 [6];
  double adStack_60 [6];
  
  pNVar11 = (NodePtr)PooledAllocator::malloc(&this->pool,0x28);
  uVar12 = left - (long)obj;
  if (uVar12 <= this->m_leaf_max_size) {
    lVar23 = 0;
    pNVar11->child1 = (Node *)0x0;
    pNVar11->child2 = (Node *)0x0;
    (pNVar11->node_type).lr.left = (unsigned_long)obj;
    (pNVar11->node_type).lr.right = left;
    puVar4 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = puVar4[(long)obj];
    uVar5 = *this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar8 = *(undefined8 *)(uVar5 + uVar6 * 0x18 + lVar23);
      *(undefined8 *)(right + lVar23 * 2) = uVar8;
      *(undefined8 *)(right + 8 + lVar23 * 2) = uVar8;
      lVar23 = lVar23 + 8;
    } while (lVar23 != 0x18);
    puVar19 = (undefined1 *)
              ((long)&(obj->
                      super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
    if (puVar19 < left) {
      do {
        uVar6 = puVar4[(long)puVar19];
        lVar23 = 0;
        do {
          dVar26 = *(double *)(uVar5 + uVar6 * 0x18 + lVar23);
          if (dVar26 < *(double *)(right + lVar23 * 2)) {
            *(double *)(right + lVar23 * 2) = dVar26;
          }
          if (*(double *)(right + 8 + lVar23 * 2) < dVar26) {
            *(double *)(right + 8 + lVar23 * 2) = dVar26;
          }
          lVar23 = lVar23 + 8;
        } while (lVar23 != 0x18);
        puVar19 = puVar19 + 1;
      } while (puVar19 != (undefined1 *)left);
    }
    return pNVar11;
  }
  puVar2 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = 0;
  uVar22 = 0;
  uVar20 = 0;
  puVar4 = puVar2 + (long)obj;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(double *)(right + 8) - *(double *)right;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(double *)(right + 0x18) - *(double *)(right + 0x10);
  auVar31 = vmaxsd_avx(auVar33,auVar31);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(double *)(right + 0x28) - *(double *)(right + 0x20);
  auVar31 = vmaxsd_avx(auVar34,auVar31);
  dVar26 = -1.0;
  do {
    if (auVar31._0_8_ * 0.99999 <
        *(double *)(right + 8 + uVar20 * 0x10) - *(double *)(right + uVar20 * 0x10)) {
      lVar23 = uVar20 * 8 + *puVar3;
      auVar28._0_8_ = *(double *)(lVar23 + *puVar4 * 0x18);
      auVar28._8_8_ = 0;
      puVar19 = (undefined1 *)
                ((long)&(obj->
                        super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                        ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1);
      auVar33 = auVar28;
      auVar34 = auVar28;
      dVar7 = auVar28._0_8_;
      if (1 < uVar12) {
        do {
          puVar16 = puVar19 + 1;
          uVar1 = *(ulong *)(lVar23 + puVar2[(long)puVar19] * 0x18);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar1;
          uVar8 = vcmpsd_avx512f(auVar39,auVar34,1);
          bVar24 = (bool)((byte)uVar8 & 1);
          auVar34 = vminsd_avx(auVar39,auVar34);
          dVar7 = auVar34._0_8_;
          auVar27._0_8_ = (ulong)bVar24 * auVar28._0_8_ + (ulong)!bVar24 * auVar33._0_8_;
          auVar27._8_8_ = auVar33._8_8_;
          uVar8 = vcmpsd_avx512f(auVar27,auVar39,1);
          bVar24 = (bool)((byte)uVar8 & 1);
          auVar33 = vmaxsd_avx(auVar39,auVar27);
          auVar28._0_8_ = (double)(bVar24 * uVar1 + (ulong)!bVar24 * auVar28._0_8_);
          puVar19 = puVar16;
        } while ((undefined1 *)left != puVar16);
      }
      if (dVar26 < auVar28._0_8_ - dVar7) {
        uVar15 = uVar20 & 0xffffffff;
        uVar22 = uVar20 & 0xffffffff;
        dVar26 = auVar28._0_8_ - dVar7;
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != 3);
  lVar21 = (long)(int)uVar22 * 0x10;
  lVar23 = (long)(int)uVar22 * 8 + *puVar3;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(lVar23 + *puVar4 * 0x18);
  auVar31 = auVar37;
  auVar30 = auVar37;
  if (1 < uVar12) {
    puVar19 = (undefined1 *)
              ((long)&(obj->
                      super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
    do {
      puVar3 = puVar2 + (long)puVar19;
      puVar19 = puVar19 + 1;
      uVar20 = *(ulong *)(lVar23 + *puVar3 * 0x18);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar20;
      uVar8 = vcmpsd_avx512f(auVar38,auVar31,1);
      bVar24 = (bool)((byte)uVar8 & 1);
      auVar31 = vminsd_avx(auVar38,auVar31);
      auVar29._0_8_ = (ulong)bVar24 * auVar30._0_8_ + (ulong)!bVar24 * auVar37._0_8_;
      auVar29._8_8_ = auVar37._8_8_;
      uVar8 = vcmpsd_avx512f(auVar29,auVar38,1);
      bVar24 = (bool)((byte)uVar8 & 1);
      auVar37 = vmaxsd_avx(auVar38,auVar29);
      auVar30._0_8_ = bVar24 * uVar20 + (ulong)!bVar24 * auVar30._0_8_;
    } while ((undefined1 *)left != puVar19);
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (*(double *)(right + lVar21) + *(double *)(right + 8 + lVar21)) * 0.5;
  uVar8 = vcmpsd_avx512f(auVar32,auVar31,1);
  bVar24 = (bool)((byte)uVar8 & 1);
  auVar33 = vminsd_avx(auVar30,auVar32);
  bbox_00 = (BoundingBox *)(uVar12 - 1);
  pBVar18 = (BoundingBox *)0x0;
  dVar26 = (double)((ulong)bVar24 * auVar31._0_8_ + (ulong)!bVar24 * auVar33._0_8_);
  pBVar17 = bbox_00;
  do {
    while ((pBVar18 <= pBVar17 && (*(double *)(lVar23 + puVar4[(long)pBVar18] * 0x18) < dVar26))) {
      pBVar18 = (BoundingBox *)((long)&pBVar18->_M_elems[0].low + 1);
    }
    bVar24 = pBVar17 != (BoundingBox *)0x0;
    pBVar13 = pBVar17;
    if (pBVar18 <= pBVar17 && bVar24) {
      while (dVar26 <= *(double *)(lVar23 + puVar4[(long)pBVar17] * 0x18)) {
        bVar24 = pBVar17 != (BoundingBox *)0x1;
        pBVar13 = (BoundingBox *)((long)&pBVar17[-1]._M_elems[2].high + 7);
        if ((pBVar13 < pBVar18) ||
           (bVar25 = pBVar17 == (BoundingBox *)0x1, pBVar17 = pBVar13, bVar25)) goto LAB_001ad160;
      }
      bVar24 = true;
      pBVar13 = pBVar17;
    }
LAB_001ad160:
    pBVar17 = pBVar18;
    if ((pBVar13 < pBVar18) || (!bVar24)) {
      do {
        while ((pBVar17 <= bbox_00 && (*(double *)(lVar23 + puVar4[(long)pBVar17] * 0x18) <= dVar26)
               )) {
          pBVar17 = (BoundingBox *)((long)&pBVar17->_M_elems[0].low + 1);
        }
        bVar24 = bbox_00 != (BoundingBox *)0x0;
        pBVar13 = bbox_00;
        if ((bVar24) && (pBVar17 <= bbox_00)) {
          while (dVar26 < *(double *)(lVar23 + puVar4[(long)bbox_00] * 0x18)) {
            bVar24 = bbox_00 != (BoundingBox *)0x1;
            pBVar13 = (BoundingBox *)((long)&bbox_00[-1]._M_elems[2].high + 7);
            if ((pBVar13 < pBVar17) ||
               (bVar25 = bbox_00 == (BoundingBox *)0x1, bbox_00 = pBVar13, bVar25))
            goto LAB_001ad1e9;
          }
          bVar24 = true;
          pBVar13 = bbox_00;
        }
LAB_001ad1e9:
        if ((pBVar13 < pBVar17) || (!bVar24)) {
          pBVar13 = (BoundingBox *)(uVar12 >> 1);
          lVar23 = (long)(int)uVar15;
          if (pBVar13 <= pBVar17) {
            pBVar17 = pBVar13;
          }
          if (pBVar13 < pBVar18) {
            pBVar17 = pBVar18;
          }
          obj_00 = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                    *)((long)&(obj->
                              super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                              ).root_bbox._M_elems[0].low + (long)(pBVar17->_M_elems + -4));
          (pNVar11->node_type).sub.divfeat = (int)uVar15;
          alStack_90[5] = *(long *)right;
          adStack_60[0] = *(double *)(right + 8);
          adStack_60[1] = *(double *)(right + 0x10);
          adStack_60[2] = *(double *)(right + 0x18);
          adStack_60[3] = *(double *)(right + 0x20);
          adStack_60[4] = *(double *)(right + 0x28);
          adStack_60[lVar23 * 2] = dVar26;
          pNVar14 = divideTree(this,obj,(unsigned_long)obj_00,(unsigned_long)(alStack_90 + 5),
                               bbox_00);
          pNVar11->child1 = pNVar14;
          local_98 = *(double *)right;
          alStack_90[0] = *(long *)(right + 8);
          alStack_90[1] = *(undefined8 *)(right + 0x10);
          alStack_90[2] = *(undefined8 *)(right + 0x18);
          alStack_90[3] = *(undefined8 *)(right + 0x20);
          alStack_90[4] = *(undefined8 *)(right + 0x28);
          (&local_98)[lVar23 * 2] = dVar26;
          pNVar14 = divideTree(this,obj_00,left,(unsigned_long)&local_98,bbox_00);
          pNVar11->child2 = pNVar14;
          lVar21 = 0;
          (pNVar11->node_type).lr.right = (unsigned_long)adStack_60[lVar23 * 2];
          (pNVar11->node_type).sub.divhigh = (&local_98)[lVar23 * 2];
          do {
            lVar23 = *(long *)((long)adStack_60 + lVar21 + -8);
            lVar9 = *(long *)((long)adStack_60 + lVar21);
            lVar10 = *(long *)((long)alStack_90 + lVar21);
            auVar35._8_8_ = lVar9;
            auVar35._0_8_ = *(long *)((long)&local_98 + lVar21);
            auVar36._8_8_ = lVar10;
            auVar36._0_8_ = lVar23;
            uVar12 = vcmppd_avx512vl(auVar35,auVar36,1);
            bVar24 = (bool)((byte)(uVar12 & 3) & 1);
            uVar12 = (uVar12 & 3) >> 1;
            *(ulong *)(right + lVar21) =
                 (ulong)bVar24 * *(long *)((long)&local_98 + lVar21) | (ulong)!bVar24 * lVar23;
            ((ulong *)(right + lVar21))[1] = uVar12 * lVar10 | (ulong)!SUB81(uVar12,0) * lVar9;
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x30);
          return pNVar11;
        }
        uVar6 = puVar4[(long)pBVar17];
        puVar4[(long)pBVar17] = puVar4[(long)pBVar13];
        puVar4[(long)pBVar13] = uVar6;
        bbox_00 = (BoundingBox *)((long)&pBVar13[-1]._M_elems[2].high + 7);
        pBVar17 = (BoundingBox *)((long)&pBVar17->_M_elems[0].low + 1);
      } while( true );
    }
    uVar6 = puVar4[(long)pBVar18];
    puVar4[(long)pBVar18] = puVar4[(long)pBVar13];
    puVar4[(long)pBVar13] = uVar6;
    pBVar17 = (BoundingBox *)((long)&pBVar13[-1]._M_elems[2].high + 7);
    pBVar18 = (BoundingBox *)((long)&pBVar18->_M_elems[0].low + 1);
  } while( true );
}

Assistant:

NodePtr divideTree(Derived &obj, const IndexType left, const IndexType right,
                     BoundingBox &bbox) {
    NodePtr node = obj.pool.template allocate<Node>(); // allocate memory

    /* If too few exemplars remain, then make this a leaf node. */
    if ((right - left) <= static_cast<IndexType>(obj.m_leaf_max_size)) {
      node->child1 = node->child2 = NULL; /* Mark as leaf node. */
      node->node_type.lr.left = left;
      node->node_type.lr.right = right;

      // compute bounding-box of leaf points
      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = dataset_get(obj, obj.vind[left], i);
        bbox[i].high = dataset_get(obj, obj.vind[left], i);
      }
      for (IndexType k = left + 1; k < right; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
          if (bbox[i].low > dataset_get(obj, obj.vind[k], i))
            bbox[i].low = dataset_get(obj, obj.vind[k], i);
          if (bbox[i].high < dataset_get(obj, obj.vind[k], i))
            bbox[i].high = dataset_get(obj, obj.vind[k], i);
        }
      }
    } else {
      IndexType idx;
      int cutfeat;
      DistanceType cutval;
      middleSplit_(obj, &obj.vind[0] + left, right - left, idx, cutfeat, cutval,
                   bbox);

      node->node_type.sub.divfeat = cutfeat;

      BoundingBox left_bbox(bbox);
      left_bbox[cutfeat].high = cutval;
      node->child1 = divideTree(obj, left, left + idx, left_bbox);

      BoundingBox right_bbox(bbox);
      right_bbox[cutfeat].low = cutval;
      node->child2 = divideTree(obj, left + idx, right, right_bbox);

      node->node_type.sub.divlow = left_bbox[cutfeat].high;
      node->node_type.sub.divhigh = right_bbox[cutfeat].low;

      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = std::min(left_bbox[i].low, right_bbox[i].low);
        bbox[i].high = std::max(left_bbox[i].high, right_bbox[i].high);
      }
    }

    return node;
  }